

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ConcurrentAssertionStatementSyntax * __thiscall
slang::parsing::Parser::parseConcurrentAssertion
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token keyword_00;
  Token propertyOrSequence_00;
  Token openParen_00;
  bool bVar1;
  NamedLabelSyntax *label_00;
  ActionBlockSyntax *pAVar2;
  ConcurrentAssertionStatementSyntax *pCVar3;
  undefined8 in_RSI;
  Info *in_RDI;
  Token TVar4;
  Token TVar5;
  ActionBlockSyntax *action;
  Token closeParen;
  PropertySpecSyntax *spec;
  Token openParen;
  Token keyword;
  Token propertyOrSequence;
  SyntaxKind kind;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe38;
  TokenKind in_stack_fffffffffffffe3e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe40;
  ParserBase *in_stack_fffffffffffffe50;
  Info *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffeb8;
  TokenKind kind_00;
  ParserBase *in_stack_fffffffffffffec0;
  Parser *in_stack_ffffffffffffff00;
  Info *local_d8;
  Info *local_d0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_b8;
  ActionBlockSyntax *local_b0;
  ActionBlockSyntax *local_a0;
  ActionBlockSyntax *local_90;
  ActionBlockSyntax *local_80;
  ActionBlockSyntax *local_70;
  TokenKind local_60;
  ActionBlockSyntax *local_50;
  
  kind_00 = (TokenKind)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
  Token::Token((Token *)in_stack_fffffffffffffe30);
  TVar4 = ParserBase::consume(in_stack_fffffffffffffe50);
  local_60 = TVar4.kind;
  if (local_60 == AssertKeyword) {
    TVar4 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
    local_70 = TVar4._0_8_;
    local_50 = local_70;
  }
  else if (local_60 == AssumeKeyword) {
    TVar4 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
    local_80 = TVar4._0_8_;
    local_50 = local_80;
  }
  else if (local_60 == CoverKeyword) {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe40._M_extent_value,
                             in_stack_fffffffffffffe3e);
    if (bVar1) {
      TVar4 = ParserBase::consume(in_stack_fffffffffffffe50);
      local_90 = TVar4._0_8_;
      local_50 = local_90;
    }
    else {
      TVar4 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
      local_a0 = TVar4._0_8_;
      local_50 = local_a0;
    }
  }
  else if (local_60 != ExpectKeyword) {
    TVar4 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
    local_b0 = TVar4._0_8_;
    local_50 = local_b0;
  }
  TVar4 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
  label_00 = (NamedLabelSyntax *)parsePropertySpec(in_stack_ffffffffffffff00);
  TVar5 = ParserBase::expect(in_stack_fffffffffffffec0,kind_00);
  pAVar2 = parseActionBlock((Parser *)in_stack_fffffffffffffe40._M_extent_value);
  elements._M_ptr._6_2_ = in_stack_fffffffffffffe3e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffe38;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe40._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (in_stack_fffffffffffffe30,elements);
  local_b8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar4.info;
  local_d8 = TVar5._0_8_;
  local_d0 = TVar5.info;
  keyword_00.info = in_stack_fffffffffffffe68;
  keyword_00._0_8_ = pAVar2;
  propertyOrSequence_00.info = in_RDI;
  propertyOrSequence_00.kind = (short)in_RSI;
  propertyOrSequence_00._2_1_ = (char)((ulong)in_RSI >> 0x10);
  propertyOrSequence_00.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  propertyOrSequence_00.rawLen = (int)((ulong)in_RSI >> 0x20);
  openParen_00.rawLen._2_2_ = local_60;
  openParen_00._0_6_ = in_stack_fffffffffffffe90;
  openParen_00.info = local_d8;
  pCVar3 = slang::syntax::SyntaxFactory::concurrentAssertionStatement
                     ((SyntaxFactory *)local_d0,TVar5.rawLen,label_00,local_b8,keyword_00,
                      propertyOrSequence_00,openParen_00,(PropertySpecSyntax *)local_d0,TVar4,
                      local_50);
  return pCVar3;
}

Assistant:

ConcurrentAssertionStatementSyntax& Parser::parseConcurrentAssertion(NamedLabelSyntax* label,
                                                                     AttrList attributes) {

    SyntaxKind kind = SyntaxKind::Unknown;
    Token propertyOrSequence;
    auto keyword = consume();

    switch (keyword.kind) {
        case TokenKind::AssertKeyword:
            kind = SyntaxKind::AssertPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::AssumeKeyword:
            kind = SyntaxKind::AssumePropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::CoverKeyword:
            if (peek(TokenKind::SequenceKeyword)) {
                kind = SyntaxKind::CoverSequenceStatement;
                propertyOrSequence = consume();
            }
            else {
                kind = SyntaxKind::CoverPropertyStatement;
                propertyOrSequence = expect(TokenKind::PropertyKeyword);
            }
            break;
        case TokenKind::RestrictKeyword:
            kind = SyntaxKind::RestrictPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::ExpectKeyword:
            kind = SyntaxKind::ExpectPropertyStatement;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& spec = parsePropertySpec();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& action = parseActionBlock();

    return factory.concurrentAssertionStatement(kind, label, attributes, keyword,
                                                propertyOrSequence, openParen, spec, closeParen,
                                                action);
}